

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImGuiContextHook>::push_back(ImVector<ImGuiContextHook> *this,ImGuiContextHook *v)

{
  ImGuiContextHook *pIVar1;
  undefined8 *in_RSI;
  ImVector<ImGuiContextHook> *in_RDI;
  ImVector<ImGuiContextHook> *unaff_retaddr;
  ImVector<ImGuiContextHook> *pIVar2;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar2 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar2 >> 0x20));
  }
  pIVar1 = in_RDI->Data + (long)in_RDI->Size * 0x20;
  *(undefined8 *)pIVar1 = *in_RSI;
  *(undefined8 *)(pIVar1 + 8) = in_RSI[1];
  *(undefined8 *)(pIVar1 + 0x10) = in_RSI[2];
  *(undefined8 *)(pIVar1 + 0x18) = in_RSI[3];
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }